

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

int countSkin(atom *src,atom *scratch,pointSet *dots)

{
  point3d *ppVar1;
  uint uVar2;
  int iVar3;
  atom_t *paVar4;
  pointSet *ppVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  point3d dotloc;
  point3d dotvect;
  vector3d local_60;
  vector3d local_48;
  
  uVar2 = src->elem;
  iVar3 = 0;
  if ((uVar2 | 4) != 5) {
    ppVar5 = dots + (int)uVar2;
    if ((uVar2 == 6) && (iVar3 = isCarbonylAtom(src), iVar3 != 0)) {
      ppVar5 = &COdots;
    }
    iVar3 = 0;
    if (0 < ppVar5->n) {
      lVar6 = 0;
      iVar3 = 0;
      do {
        local_48.z = ppVar5->p[lVar6].z;
        ppVar1 = ppVar5->p + lVar6;
        local_48.x = ppVar1->x;
        local_48.y = ppVar1->y;
        v3add(&src->loc,&local_48,&local_60);
        paVar4 = scratch;
        bVar7 = scratch == (atom *)0x0;
        if (scratch != (atom *)0x0) {
          do {
            if ((((paVar4->elem != 1) && (paVar4->elem != 5)) && (paVar4->mark != 0)) &&
               (dVar8 = local_60.x - (paVar4->loc).x, dVar9 = local_60.y - (paVar4->loc).y,
               dVar10 = local_60.z - (paVar4->loc).z,
               dVar10 * dVar10 + dVar8 * dVar8 + dVar9 * dVar9 <=
               (double)(paVar4->radius * paVar4->radius))) break;
            bVar7 = paVar4->scratch == (atom_t *)0x0;
            paVar4 = paVar4->scratch;
          } while (!bVar7);
        }
        iVar3 = iVar3 + (uint)bVar7;
        lVar6 = lVar6 + 1;
      } while (lVar6 < ppVar5->n);
    }
  }
  return iVar3;
}

Assistant:

int countSkin(atom *src, atom *scratch, pointSet dots[])
{
   atom *targ = NULL;
   int i = 0, within = 0, ok = 0;
   point3d dotloc, dotvect;
   pointSet *srcDots;
   int dotCnt = 0;

   if (src->elem == ignoreAtom
    || src->elem == atomHOd)   { return 0; } /*hb-only-dummy, phantom H atom*/

   srcDots = &(dots[src->elem]);
   if (src->elem == atomC && isCarbonylAtom(src)) {
      srcDots = &COdots;
   }

   for(i=0; i < srcDots->n; i++) {
      dotvect = srcDots->p[i];

      v3add(&(src->loc), &dotvect, &dotloc);

      ok = TRUE;

      /*targ is an atom*, scratch is an atom*,  atom* defined in abin.h */
      /* atom* scratch is a member of atom*: which has member scratch...*/
      /* so for-loop moves through all these atoms while an atom has a scratch*/

      for(targ = scratch; targ; targ = targ->scratch) {
	 if (targ->elem == ignoreAtom) {continue;}

	 /* eliminate if within bonded atom! */
	 if (targ->mark && (targ->elem != atomHOd)) {
#ifdef INLINE_FOR_SPEED
	    within = INRANGEINLINE(dotloc, (targ->loc), targ->radius);
#else
	    within = inRange(&dotloc, &(targ->loc), targ->radius);
#endif

	    if (within) { ok = FALSE; break; }
	 }
      }
      if (ok) { dotCnt++; }
   }
   return dotCnt;
}